

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest6::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest6 *this,bool include_invalid_declaration)

{
  char *pcVar1;
  stringstream result_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\n"
             ,0x8b);
  if (include_invalid_declaration) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "subroutine void subroutineTestTypeGS(out vec4 test);\n\nsubroutine(subroutineTestTypeGS) void test_impl1(out vec4 test)\n{\n    test = vec4(1, 2, 3, 4);\n}\n\nvoid test_impl1(out vec4 test)\n{\n    test = vec4(2, 3, 4, 5);\n}\n\nsubroutine uniform subroutineTestTypeGS test_subroutineGS;\n"
               ,0x114);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\nvoid main()\n{\n",0xf);
  pcVar1 = "    gl_Position = vec4(0, 1, 2, 3);\n";
  if (include_invalid_declaration) {
    pcVar1 = "    test_subroutineGS(gl_Position);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar1,0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"EmitVertex();\n}\n",0x10)
  ;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest6::getGeometryShaderBody(bool include_invalid_declaration) const
{
	std::stringstream result_sstream;

	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  "layout (points)                   in;\n"
					  "layout (points, max_vertices = 1) out;\n"
					  "\n";

	if (include_invalid_declaration)
	{
		result_sstream << "subroutine void subroutineTestTypeGS(out vec4 test);\n"
						  "\n"
						  "subroutine(subroutineTestTypeGS) void test_impl1(out vec4 test)\n"
						  "{\n"
						  "    test = vec4(1, 2, 3, 4);\n"
						  "}\n"
						  "\n"
						  "void test_impl1(out vec4 test)\n"
						  "{\n"
						  "    test = vec4(2, 3, 4, 5);\n"
						  "}\n"
						  "\n"
						  "subroutine uniform subroutineTestTypeGS test_subroutineGS;\n";
	};

	result_sstream << "\n"
					  "void main()\n"
					  "{\n";

	if (include_invalid_declaration)
	{
		result_sstream << "    test_subroutineGS(gl_Position);\n";
	}
	else
	{
		result_sstream << "    gl_Position = vec4(0, 1, 2, 3);\n";
	}

	result_sstream << "EmitVertex();\n"
					  "}\n";

	return result_sstream.str();
}